

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_flush_output(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  int line;
  int iVar5;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x970,"=> flush output");
  if (ssl->f_send == (mbedtls_ssl_send_t *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x975,"Bad usage of mbedtls_ssl_set_bio() or mbedtls_ssl_set_bio()");
    iVar5 = -0x7100;
  }
  else {
    sVar4 = ssl->out_left;
    if (sVar4 == 0) {
      line = 0x97c;
    }
    else {
      do {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x983,"message length: %d, out_left: %d",
                   ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5,sVar4);
        uVar3 = (*ssl->f_send)(ssl->p_bio,
                               ssl->out_hdr +
                               ((ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4
                                ) - ssl->out_left) + 5,ssl->out_left);
        mbedtls_debug_print_ret
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x989,"ssl->f_send",uVar3);
        if ((int)uVar3 < 1) {
          return uVar3;
        }
        sVar4 = ssl->out_left - (ulong)uVar3;
        ssl->out_left = sVar4;
      } while (sVar4 != 0);
      bVar2 = 8;
      do {
        puVar1 = ssl->out_ctr + ((ulong)bVar2 - 1);
        *puVar1 = *puVar1 + '\x01';
        if (*puVar1 != '\0') {
          uVar3 = *(uint *)&ssl->conf->field_0x174 & 2;
          break;
        }
        bVar2 = bVar2 - 1;
        uVar3 = *(uint *)&ssl->conf->field_0x174 & 2;
      } while (uVar3 < bVar2);
      if (uVar3 == bVar2) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x998,"outgoing message counter would wrap");
        return -0x6b80;
      }
      line = 0x99c;
    }
    iVar5 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,line,"<= flush output");
  }
  return iVar5;
}

Assistant:

int mbedtls_ssl_flush_output( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *buf, i;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> flush output" ) );

    if( ssl->f_send == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "Bad usage of mbedtls_ssl_set_bio() "
                            "or mbedtls_ssl_set_bio()" ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    /* Avoid incrementing counter if data is flushed */
    if( ssl->out_left == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= flush output" ) );
        return( 0 );
    }

    while( ssl->out_left > 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "message length: %d, out_left: %d",
                       mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen, ssl->out_left ) );

        buf = ssl->out_hdr + mbedtls_ssl_hdr_len( ssl ) +
              ssl->out_msglen - ssl->out_left;
        ret = ssl->f_send( ssl->p_bio, buf, ssl->out_left );

        MBEDTLS_SSL_DEBUG_RET( 2, "ssl->f_send", ret );

        if( ret <= 0 )
            return( ret );

        ssl->out_left -= ret;
    }

    for( i = 8; i > ssl_ep_len( ssl ); i-- )
        if( ++ssl->out_ctr[i - 1] != 0 )
            break;

    /* The loop goes to its end iff the counter is wrapping */
    if( i == ssl_ep_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "outgoing message counter would wrap" ) );
        return( MBEDTLS_ERR_SSL_COUNTER_WRAPPING );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= flush output" ) );

    return( 0 );
}